

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditImageCompareTests.cpp
# Opt level: O0

void __thiscall dit::BilinearCompareCase::~BilinearCompareCase(BilinearCompareCase *this)

{
  BilinearCompareCase *this_local;
  
  ~BilinearCompareCase(this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

BilinearCompareCase (tcu::TestContext& testCtx, const char* name, const char* refImg, const char* cmpImg, const tcu::RGBA& threshold, bool expectedResult)
		: tcu::TestCase		(testCtx, name, "")
		, m_refImg			(refImg)
		, m_cmpImg			(cmpImg)
		, m_threshold		(threshold)
		, m_expectedResult	(expectedResult)
	{
	}